

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint32_t __thiscall google::protobuf::io::CodedInputStream::ReadTagSlow(CodedInputStream *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  pair<unsigned_long,_bool> pVar5;
  
  if ((*(long *)this == *(long *)(this + 8)) && (bVar3 = Refresh(this), !bVar3)) {
    if (*(int *)(this + 0x18) - *(int *)(this + 0x2c) < *(int *)(this + 0x30)) {
      this[0x24] = (CodedInputStream)0x1;
    }
    else {
      this[0x24] = (CodedInputStream)(*(int *)(this + 0x28) == *(int *)(this + 0x30));
    }
    return 0;
  }
  pcVar2 = *(char **)this;
  if ((pcVar2 < *(char **)(this + 8)) && (cVar1 = *pcVar2, -1 < (long)cVar1)) {
    *(char **)this = pcVar2 + 1;
    pVar5._8_8_ = 1;
    pVar5.first = (long)cVar1;
  }
  else {
    pVar5 = ReadVarint64Fallback(this);
  }
  uVar4 = 0;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar4 = (uint32_t)pVar5.first;
  }
  return uVar4;
}

Assistant:

uint32_t CodedInputStream::ReadTagSlow() {
  if (buffer_ == buffer_end_) {
    // Call refresh.
    if (!Refresh()) {
      // Refresh failed.  Make sure that it failed due to EOF, not because
      // we hit total_bytes_limit_, which, unlike normal limits, is not a
      // valid place to end a message.
      int current_position = total_bytes_read_ - buffer_size_after_limit_;
      if (current_position >= total_bytes_limit_) {
        // Hit total_bytes_limit_.  But if we also hit the normal limit,
        // we're still OK.
        legitimate_message_end_ = current_limit_ == total_bytes_limit_;
      } else {
        legitimate_message_end_ = true;
      }
      return 0;
    }
  }

  // For the slow path, just do a 64-bit read. Try to optimize for one-byte tags
  // again, since we have now refreshed the buffer.
  uint64_t result = 0;
  if (!ReadVarint64(&result)) return 0;
  return static_cast<uint32_t>(result);
}